

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd-socket.c
# Opt level: O3

FdSocket * make_fd_socket_internal(SockAddr *addr,int port,Plug *plug)

{
  FdSocket *pFVar1;
  
  pFVar1 = (FdSocket *)safemalloc(1,0x2098,0);
  (pFVar1->sock).vt = &FdSocket_sockvt;
  pFVar1->addr = addr;
  pFVar1->port = port;
  pFVar1->plug = plug;
  pFVar1->outgoingeof = EOF_NO;
  pFVar1->pending_error = 0;
  pFVar1->opener = (DeferredSocketOpener *)0x0;
  pFVar1->inerrfd = -1;
  pFVar1->outfd = -1;
  pFVar1->infd = -1;
  bufchain_init(&pFVar1->pending_input_data);
  bufchain_init(&pFVar1->pending_output_data);
  psb_init(&pFVar1->psb);
  return pFVar1;
}

Assistant:

static FdSocket *make_fd_socket_internal(SockAddr *addr, int port, Plug *plug)
{
    FdSocket *fds;

    fds = snew(FdSocket);
    fds->sock.vt = &FdSocket_sockvt;
    fds->addr = addr;
    fds->port = port;
    fds->plug = plug;
    fds->outgoingeof = EOF_NO;
    fds->pending_error = 0;

    fds->opener = NULL;
    fds->infd = fds->outfd = fds->inerrfd = -1;

    bufchain_init(&fds->pending_input_data);
    bufchain_init(&fds->pending_output_data);
    psb_init(&fds->psb);

    return fds;
}